

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANSIFontWriter.cpp
# Opt level: O2

void __thiscall ANSIFontWriter::CalculateCharacterEncodingArray(ANSIFontWriter *this)

{
  WrittenFontRepresentation *pWVar1;
  _Base_ptr p_Var2;
  pair<unsigned_int,_GlyphEncodingInfo> local_50;
  
  pWVar1 = this->mFontOccurrence;
  p_Var2 = (pWVar1->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var2 !=
         &(pWVar1->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header) {
    std::pair<unsigned_int,_GlyphEncodingInfo>::pair<GlyphEncodingInfo_&,_true>
              (&local_50,&p_Var2[1]._M_color,(GlyphEncodingInfo *)&p_Var2[1]._M_parent);
    std::
    vector<std::pair<unsigned_int,GlyphEncodingInfo>,std::allocator<std::pair<unsigned_int,GlyphEncodingInfo>>>
    ::emplace_back<std::pair<unsigned_int,GlyphEncodingInfo>>
              ((vector<std::pair<unsigned_int,GlyphEncodingInfo>,std::allocator<std::pair<unsigned_int,GlyphEncodingInfo>>>
                *)&this->mCharactersVector,&local_50);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&local_50.second.mUnicodeCharacters.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    pWVar1 = this->mFontOccurrence;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,GlyphEncodingInfo>*,std::vector<std::pair<unsigned_int,GlyphEncodingInfo>,std::allocator<std::pair<unsigned_int,GlyphEncodingInfo>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<unsigned_int,GlyphEncodingInfo>const&,std::pair<unsigned_int,GlyphEncodingInfo>const&)>>
            ((this->mCharactersVector).
             super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->mCharactersVector).
             super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_std::pair<unsigned_int,_GlyphEncodingInfo>_&,_const_std::pair<unsigned_int,_GlyphEncodingInfo>_&)>
              )0x1d746e);
  return;
}

Assistant:

void ANSIFontWriter::CalculateCharacterEncodingArray()
{
	// first we need to sort the fonts charachters by character code
	UIntToGlyphEncodingInfoMap::iterator it = mFontOccurrence->mGlyphIDToEncodedChar.begin();

	for(; it != mFontOccurrence->mGlyphIDToEncodedChar.end();++it)
		mCharactersVector.push_back(UIntAndGlyphEncodingInfo(it->first,it->second));

	std::sort(mCharactersVector.begin(),mCharactersVector.end(),sUShortSort);
}